

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseTypeObject(JSONParser *this,Type *out_type)

{
  bool bVar1;
  Result RVar2;
  Type *out_type_local;
  JSONParser *this_local;
  
  RVar2 = Expect(this,"{");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ExpectKey(this,"type");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2 = ParseType(this,out_type);
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        RVar2 = Expect(this,"}");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseTypeObject(Type* out_type) {
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(out_type));
  EXPECT("}");
  return wabt::Result::Ok;
}